

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::
     print<char[14],diy::DynamicPoint<float,4ul>const&,diy::DynamicPoint<float,4ul>const&,char>
               (char (*format_str) [14],DynamicPoint<float,_4UL> *args,
               DynamicPoint<float,_4UL> *args_1)

{
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_diy::DynamicPoint<float,_4UL>,_const_diy::DynamicPoint<float,_4UL>_>
  *vargs;
  remove_reference_t<const_diy::DynamicPoint<float>_&> *in_stack_ffffffffffffff78;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_stack_ffffffffffffff80;
  char (*in_stack_ffffffffffffff88) [14];
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa8;
  
  make_args_checked<diy::DynamicPoint<float,4ul>const&,diy::DynamicPoint<float,4ul>const&,char[14],char>
            (in_stack_ffffffffffffff88,
             (remove_reference_t<const_diy::DynamicPoint<float>_&> *)
             in_stack_ffffffffffffff80.values_,in_stack_ffffffffffffff78);
  to_string_view<char,_0>((char *)0x16e273);
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&stack0xffffffffffffff78,0xff,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&stack0xffffffffffffff98);
  vprint(in_stack_ffffffffffffffa8,(format_args)in_stack_ffffffffffffff98);
  return;
}

Assistant:

inline void print(const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(to_string_view(format_str), vargs)
             : detail::vprint_mojibake(stdout, to_string_view(format_str),
                                       vargs);
}